

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_split.cpp
# Opt level: O0

void midpt_split(ANNpointArray pa,ANNidxArray pidx,ANNorthRect *bnds,int n,int dim,int *cut_dim,
                ANNcoord *cut_val,int *n_lo)

{
  int in_ECX;
  long *in_RDX;
  ANNidxArray in_RSI;
  ANNpointArray in_RDI;
  int in_R8D;
  int *in_R9;
  ANNcoord *in_stack_00000008;
  int br2;
  int br1;
  ANNcoord spr;
  ANNcoord max_spread;
  ANNcoord length;
  ANNcoord max_length;
  int d;
  int local_58;
  int local_54;
  ANNcoord local_50;
  ANNcoord local_48;
  double local_40;
  double local_38;
  int local_2c;
  int *local_28;
  int local_20;
  int local_1c;
  long *local_18;
  ANNidxArray local_10;
  ANNpointArray local_8;
  
  local_38 = *(double *)in_RDX[1] - *(double *)*in_RDX;
  for (local_2c = 1; local_2c < in_R8D; local_2c = local_2c + 1) {
    local_40 = *(double *)(in_RDX[1] + (long)local_2c * 8) -
               *(double *)(*in_RDX + (long)local_2c * 8);
    if (local_38 < local_40) {
      local_38 = local_40;
    }
  }
  local_48 = -1.0;
  local_28 = in_R9;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_2c = 0; local_2c < local_20; local_2c = local_2c + 1) {
    if ((local_38 * 0.999 <=
         *(double *)(local_18[1] + (long)local_2c * 8) - *(double *)(*local_18 + (long)local_2c * 8)
        ) && (local_50 = annSpread(local_8,local_10,local_1c,local_2c), local_48 < local_50)) {
      *local_28 = local_2c;
      local_48 = local_50;
    }
  }
  *in_stack_00000008 =
       (*(double *)(*local_18 + (long)*local_28 * 8) +
       *(double *)(local_18[1] + (long)*local_28 * 8)) / 2.0;
  annPlaneSplit(local_8,local_10,local_1c,*local_28,*in_stack_00000008,&local_54,&local_58);
  if (local_1c / 2 < local_54) {
    *_br2 = local_54;
  }
  else if (local_58 < local_1c / 2) {
    *_br2 = local_58;
  }
  else {
    *_br2 = local_1c / 2;
  }
  return;
}

Assistant:

void midpt_split(ANNpointArray pa,         // point array
                 ANNidxArray pidx,         // point indices (permuted on return)
                 const ANNorthRect &bnds,  // bounding rectangle for cell
                 int n,                    // number of points
                 int dim,                  // dimension of space
                 int &cut_dim,             // cutting dimension (returned)
                 ANNcoord &cut_val,        // cutting value (returned)
                 int &n_lo)  // num of points on low side (returned)
{
    int d;

    ANNcoord max_length = bnds.hi[0] - bnds.lo[0];
    for (d = 1; d < dim; d++) {  // find length of longest box side
        ANNcoord length = bnds.hi[d] - bnds.lo[d];
        if (length > max_length) {
            max_length = length;
        }
    }
    ANNcoord max_spread = -1;  // find long side with most spread
    for (d = 0; d < dim; d++) {
        // is it among longest?
        if (double(bnds.hi[d] - bnds.lo[d]) >= (1 - ERR) * max_length) {
            // compute its spread
            ANNcoord spr = annSpread(pa, pidx, n, d);
            if (spr > max_spread) {  // is it max so far?
                max_spread = spr;
                cut_dim = d;
            }
        }
    }
    // split along cut_dim at midpoint
    cut_val = (bnds.lo[cut_dim] + bnds.hi[cut_dim]) / 2;
    // permute points accordingly
    int br1, br2;
    annPlaneSplit(pa, pidx, n, cut_dim, cut_val, br1, br2);
    //------------------------------------------------------------------
    //	On return:	pa[0..br1-1] < cut_val
    //			pa[br1..br2-1] == cut_val
    //			pa[br2..n-1] > cut_val
    //
    //	We can set n_lo to any value in the range [br1..br2].
    //	We choose split so that points are most evenly divided.
    //------------------------------------------------------------------
    if (br1 > n / 2)
        n_lo = br1;
    else if (br2 < n / 2)
        n_lo = br2;
    else
        n_lo = n / 2;
}